

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,StringPiece name)

{
  StringPiece key;
  StringPiece name_00;
  StringPiece name_01;
  StringPiece key_00;
  StringPiece key_01;
  bool bVar1;
  pointer this_00;
  char *pcVar2;
  MutexLockMaybe local_60;
  MutexLockMaybe lock;
  MutexLock local_38;
  ReaderMutexLock lock_1;
  DescriptorPool *pool_local;
  Tables *this_local;
  StringPiece name_local;
  Symbol result;
  
  name_local.ptr_ = (char *)name.length_;
  pcVar2 = name.ptr_;
  lock_1.mu_ = (Mutex *)pool;
  if (pool->mutex_ == (WrappedMutex *)0x0) goto LAB_006471c5;
  internal::MutexLock::MutexLock(&local_38,pool->mutex_);
  bVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->known_bad_symbols_);
  if ((bVar1) &&
     (bVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->known_bad_files_), bVar1)) {
    key_01.length_ = (size_type)name_local.ptr_;
    key_01.ptr_ = pcVar2;
    name_local.length_ = (size_type)FindSymbol(this,key_01);
    bVar1 = Symbol::IsNull((Symbol *)&name_local.length_);
    if (bVar1) goto LAB_006471a5;
    lock.mu_._0_4_ = 1;
  }
  else {
LAB_006471a5:
    lock.mu_._0_4_ = 0;
  }
  internal::MutexLock::~MutexLock(&local_38);
  if ((int)lock.mu_ != 0) {
    return (Symbol)(SymbolBase *)name_local.length_;
  }
LAB_006471c5:
  internal::MutexLockMaybe::MutexLockMaybe
            (&local_60,(Mutex *)((lock_1.mu_)->mu_).super___mutex_base._M_mutex.__align);
  if (*(long *)((long)&((lock_1.mu_)->mu_).super___mutex_base._M_mutex + 8) != 0) {
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->known_bad_symbols_);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->known_bad_files_);
  }
  key_00.length_ = (size_type)name_local.ptr_;
  key_00.ptr_ = pcVar2;
  name_local.length_ = (size_type)FindSymbol(this,key_00);
  bVar1 = Symbol::IsNull((Symbol *)&name_local.length_);
  if ((bVar1) &&
     (((lock_1.mu_)->mu_).super___mutex_base._M_mutex.__data.__list.__prev !=
      (__pthread_internal_list *)0x0)) {
    this_00 = std::
              unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            *)(((lock_1.mu_)->mu_).super___mutex_base._M_mutex.__data.__list.__prev
                              + 2));
    name_01.length_ = (size_type)name_local.ptr_;
    name_01.ptr_ = pcVar2;
    name_local.length_ =
         (size_type)
         FindByNameHelper(this_00,(DescriptorPool *)
                                  ((lock_1.mu_)->mu_).super___mutex_base._M_mutex.__data.__list.
                                  __prev,name_01);
  }
  bVar1 = Symbol::IsNull((Symbol *)&name_local.length_);
  if ((bVar1) &&
     (name_00.length_ = (size_type)name_local.ptr_, name_00.ptr_ = pcVar2,
     bVar1 = TryFindSymbolInFallbackDatabase((DescriptorPool *)lock_1.mu_,name_00), bVar1)) {
    key.length_ = (size_type)name_local.ptr_;
    key.ptr_ = pcVar2;
    name_local.length_ = (size_type)FindSymbol(this,key);
  }
  lock.mu_._0_4_ = 1;
  internal::MutexLockMaybe::~MutexLockMaybe(&local_60);
  return (Symbol)(SymbolBase *)name_local.length_;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                StringPiece name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}